

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O0

void google::protobuf::StringAppendV(string *dst,char *format,__va_list_tag *ap)

{
  int iVar1;
  int iVar2;
  char *__s;
  undefined8 *in_RDX;
  char *in_RSI;
  char *in_RDI;
  ulong uVar3;
  char *buf;
  int length;
  int result;
  va_list backup_ap;
  char space [1024];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  char local_418 [1024];
  undefined8 *local_18;
  char *local_10;
  char *local_8;
  
  local_428 = in_RDX[2];
  local_438 = *in_RDX;
  uStack_430 = in_RDX[1];
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = vsnprintf(local_418,0x400,in_RSI,&local_438);
  if (iVar1 < 0x400) {
    if (-1 < iVar1) {
      std::__cxx11::string::append(local_8,(ulong)local_418);
      return;
    }
    if (iVar1 < 0) {
      return;
    }
  }
  iVar1 = iVar1 + 1;
  uVar3 = (ulong)iVar1;
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __s = (char *)operator_new__(uVar3);
  local_428 = local_18[2];
  local_438 = *local_18;
  uStack_430 = local_18[1];
  iVar2 = vsnprintf(__s,(long)iVar1,local_10,&local_438);
  if ((-1 < iVar2) && (iVar2 < iVar1)) {
    std::__cxx11::string::append(local_8,(ulong)__s);
  }
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void StringAppendV(string* dst, const char* format, va_list ap) {
  // First try with a small fixed size buffer
  static const int kSpaceLength = 1024;
  char space[kSpaceLength];

  // It's possible for methods that use a va_list to invalidate
  // the data in it upon use.  The fix is to make a copy
  // of the structure before using it and use that copy instead.
  va_list backup_ap;
  va_copy(backup_ap, ap);
  int result = vsnprintf(space, kSpaceLength, format, backup_ap);
  va_end(backup_ap);

  if (result < kSpaceLength) {
    if (result >= 0) {
      // Normal case -- everything fit.
      dst->append(space, result);
      return;
    }

    if (IS_COMPILER_MSVC) {
      // Error or MSVC running out of space.  MSVC 8.0 and higher
      // can be asked about space needed with the special idiom below:
      va_copy(backup_ap, ap);
      result = vsnprintf(nullptr, 0, format, backup_ap);
      va_end(backup_ap);
    }

    if (result < 0) {
      // Just an error.
      return;
    }
  }

  // Increase the buffer size to the size requested by vsnprintf,
  // plus one for the closing \0.
  int length = result+1;
  char* buf = new char[length];

  // Restore the va_list before we use it again
  va_copy(backup_ap, ap);
  result = vsnprintf(buf, length, format, backup_ap);
  va_end(backup_ap);

  if (result >= 0 && result < length) {
    // It fit
    dst->append(buf, result);
  }
  delete[] buf;
}